

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  Result RVar5;
  pointer __p;
  undefined8 uVar6;
  __off64_t *in_R8;
  size_t in_R9;
  long lVar7;
  uint in_stack_fffffffffffffec8;
  allocator<char> local_129;
  undefined1 local_128 [15];
  allocator<char> local_119;
  anon_union_16_2_ecfd7102_for_Location_1 local_118;
  undefined8 local_108;
  ExprList cond;
  undefined8 uStack_e0;
  string local_d8 [32];
  string local_b8 [32];
  undefined1 local_98 [8];
  intrusive_list<wabt::Expr> *local_90;
  _Head_base<0UL,_wabt::Expr_*,_false> local_88;
  _Head_base<0UL,_wabt::Expr_*,_false> local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_78;
  _Head_base<0UL,_wabt::Expr_*,_false> local_70;
  _Head_base<0UL,_wabt::Expr_*,_false> local_68;
  _Head_base<0UL,_wabt::Expr_*,_false> local_60;
  Location loc;
  
  TVar3 = Peek(this,0);
  RVar5.enum_ = Error;
  if (TVar3 != Lpar) {
    return (Result)Error;
  }
  TVar3 = Peek(this,1);
  bVar2 = anon_unknown_1::IsPlainInstr(TVar3);
  if (bVar2) {
    Consume((Token *)&cond,this);
    local_118.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    RVar4 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_118.field_0);
    if ((RVar4.enum_ == Error) || (RVar4 = ParseExprList(this,exprs), RVar4.enum_ == Error)) {
      bVar2 = false;
    }
    else {
      local_90 = exprs;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cond,"an expr",(allocator<char> *)local_128);
      loc.filename._M_len = 0;
      loc.filename._M_str = (char *)0x0;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&loc,&cond,
                 local_d8);
      bVar2 = false;
      RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&loc,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&loc);
      std::__cxx11::string::_M_dispose();
      if (RVar4.enum_ != Error) {
        local_60._M_head_impl = (Expr *)local_118.field_1.offset;
        local_118.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
        intrusive_list<wabt::Expr>::push_back
                  (local_90,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_60);
        if (local_60._M_head_impl != (Expr *)0x0) {
          (*(local_60._M_head_impl)->_vptr_Expr[1])();
        }
        local_60._M_head_impl = (Expr *)0x0;
        bVar2 = true;
      }
    }
    if (local_118.field_1.offset != 0) {
      (**(code **)(*(long *)local_118.field_1.offset + 8))();
    }
joined_r0x00151715:
    if (!bVar2) {
      return (Result)RVar5.enum_;
    }
    goto LAB_00151717;
  }
  GetLocation(&loc,this);
  TVar3 = Peek(this,1);
  if (TVar3 == TryTable) {
    Consume((Token *)&cond,this);
    Consume((Token *)&cond,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&cond);
    std::make_unique<wabt::TryTableExpr,wabt::Location&>((Location *)&local_118.field_0);
    RVar5 = ParseLabelOpt(this,(string *)((long)local_118.field_1.offset + 0x40));
    if ((((RVar5.enum_ == Error) ||
         (RVar5 = ParseBlockDeclaration
                            (this,(BlockDeclaration *)((long)local_118.field_1.offset + 0x60)),
         RVar5.enum_ == Error)) ||
        (RVar5 = ParseTryTableCatches
                           (this,(TryTableVector *)((long)local_118.field_1.offset + 0x118)),
        RVar5.enum_ == Error)) ||
       (RVar5 = ParseInstrList(this,(ExprList *)((long)local_118.field_1.offset + 0xe0)),
       RVar5.enum_ == Error)) {
      bVar2 = false;
      uVar6 = local_118.field_1.offset;
    }
    else {
      GetLocation((Location *)&cond,this);
      local_88._M_head_impl = (Expr *)local_118.field_1.offset;
      ((intrusive_list_base<wabt::Expr> *)((long)local_118.field_1.offset + 0x108))->next_ =
           (Expr *)cond.size_;
      *(undefined8 *)((long)local_118.field_1.offset + 0x110) = uStack_e0;
      *(Expr **)((long)local_118.field_1.offset + 0xf8) = cond.first_;
      ((Expr *)((long)local_118.field_1.offset + 0x100))->_vptr_Expr = (_func_int **)cond.last_;
      local_118.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_88);
      if (local_88._M_head_impl != (Expr *)0x0) {
        (*(local_88._M_head_impl)->_vptr_Expr[1])();
      }
      local_88._M_head_impl = (Expr *)0x0;
      bVar2 = true;
      uVar6 = local_118.field_1.offset;
    }
LAB_001514e8:
    if ((Expr *)uVar6 != (Expr *)0x0) {
      (**(code **)(*(long *)uVar6 + 8))();
    }
  }
  else {
    if (TVar3 == If) {
      Consume((Token *)&cond,this);
      Consume((Token *)&cond,this);
      std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)local_128);
      RVar4 = ParseLabelOpt(this,(string *)(local_128._0_8_ + 0x40));
      RVar5.enum_ = Error;
      if ((RVar4.enum_ == Error) ||
         (RVar4 = ParseBlockDeclaration
                            (this,(BlockDeclaration *)
                                  &(((Expr *)(local_128._0_8_ + 0x40))->loc).filename._M_str),
         RVar4.enum_ == Error)) {
LAB_001516ff:
        bVar2 = false;
      }
      else {
        while (bVar2 = PeekMatchExpr(this), bVar2) {
          cond.first_ = (Expr *)0x0;
          cond.last_ = (Expr *)0x0;
          cond.size_ = 0;
          RVar4 = ParseExpr(this,&cond);
          if (RVar4.enum_ == Error) {
            intrusive_list<wabt::Expr>::clear(&cond);
            goto LAB_001516ff;
          }
          intrusive_list<wabt::Expr>::splice
                    (exprs,(int)exprs,(__off64_t *)0x0,(int)&cond,in_R8,in_R9,
                     in_stack_fffffffffffffec8);
          intrusive_list<wabt::Expr>::clear(&cond);
        }
        RVar4 = Expect(this,Lpar);
        if (RVar4.enum_ == Error) goto LAB_001516ff;
        bVar2 = Match(this,Then);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cond,"then block",&local_129);
          local_118.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
          local_118._8_8_ = 0;
          local_108 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118
                     ,&cond,local_d8);
          RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_118.field_0,"(then ...)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_118.field_0);
          std::__cxx11::string::_M_dispose();
          goto LAB_001516ff;
        }
        RVar4 = ParseTerminatingInstrList
                          (this,(ExprList *)
                                &(((Expr *)(local_128._0_8_ + 0xc0))->loc).filename._M_str);
        if (RVar4.enum_ == Error) goto LAB_001516ff;
        GetLocation((Location *)&cond,this);
        (((Expr *)(local_128._0_8_ + 0x100))->super_intrusive_list_base<wabt::Expr>).next_ =
             (Expr *)cond.size_;
        (((Expr *)(local_128._0_8_ + 0x100))->super_intrusive_list_base<wabt::Expr>).prev_ =
             (Expr *)uStack_e0;
        *(Expr **)&((Expr *)(local_128._0_8_ + 0xc0))->type_ = cond.first_;
        ((Expr *)(local_128._0_8_ + 0x100))->_vptr_Expr = (_func_int **)cond.last_;
        RVar4 = Expect(this,Rpar);
        if ((RVar4.enum_ == Error) ||
           ((bVar2 = MatchLpar(this,Else), bVar2 &&
            ((RVar4 = ParseTerminatingInstrList
                                (this,(ExprList *)&((Expr *)(local_128._0_8_ + 0x100))->loc),
             RVar4.enum_ == Error || (RVar4 = Expect(this,Rpar), RVar4.enum_ == Error))))))
        goto LAB_001516ff;
        GetLocation((Location *)&cond,this);
        local_78._M_head_impl = (Expr *)local_128._0_8_;
        ((Expr *)(local_128._0_8_ + 0x140))->_vptr_Expr = (_func_int **)cond.size_;
        (((Expr *)(local_128._0_8_ + 0x140))->super_intrusive_list_base<wabt::Expr>).next_ =
             (Expr *)uStack_e0;
        *(Expr **)((long)&(((Expr *)(local_128._0_8_ + 0x100))->loc).field_1 + 8) = cond.first_;
        *(Expr **)&((Expr *)(local_128._0_8_ + 0x100))->type_ = cond.last_;
        local_128._0_8_ = (Expr *)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_78);
        if (local_78._M_head_impl != (Expr *)0x0) {
          (*(local_78._M_head_impl)->_vptr_Expr[1])();
        }
        local_78._M_head_impl = (Expr *)0x0;
        bVar2 = true;
      }
      if ((Expr *)local_128._0_8_ != (Expr *)0x0) {
        (*(*(_func_int ***)local_128._0_8_)[1])();
      }
      goto joined_r0x00151715;
    }
    if (TVar3 == Loop) {
      Consume((Token *)&cond,this);
      Consume((Token *)&cond,this);
      std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>((Location *)&cond);
      RVar5 = ParseLabelOpt(this,(string *)(cond.first_ + 1));
      if ((RVar5.enum_ != Error) &&
         (RVar5 = ParseBlock(this,(Block *)(cond.first_ + 1)), pEVar1 = cond.first_,
         RVar5.enum_ != Error)) {
        cond.first_ = (Expr *)0x0;
        local_70._M_head_impl = pEVar1;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_70);
        if (local_70._M_head_impl != (Expr *)0x0) {
          (*(local_70._M_head_impl)->_vptr_Expr[1])();
        }
        local_70._M_head_impl = (Expr *)0x0;
LAB_001514e0:
        bVar2 = true;
        uVar6 = cond.first_;
        goto LAB_001514e8;
      }
LAB_001513d2:
      bVar2 = false;
      uVar6 = cond.first_;
      goto LAB_001514e8;
    }
    if (TVar3 != Try) {
      if (TVar3 != Block) {
        __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0xcef,"Result wabt::WastParser::ParseExpr(ExprList *)");
      }
      Consume((Token *)&cond,this);
      Consume((Token *)&cond,this);
      std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>((Location *)&cond);
      RVar5 = ParseLabelOpt(this,(string *)(cond.first_ + 1));
      if ((RVar5.enum_ != Error) &&
         (RVar5 = ParseBlock(this,(Block *)(cond.first_ + 1)), pEVar1 = cond.first_,
         RVar5.enum_ != Error)) {
        cond.first_ = (Expr *)0x0;
        local_68._M_head_impl = pEVar1;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_68);
        if (local_68._M_head_impl != (Expr *)0x0) {
          (*(local_68._M_head_impl)->_vptr_Expr[1])();
        }
        local_68._M_head_impl = (Expr *)0x0;
        goto LAB_001514e0;
      }
      goto LAB_001513d2;
    }
    Consume((Token *)&cond,this);
    Consume((Token *)&cond,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&cond);
    std::make_unique<wabt::TryExpr,wabt::Location&>((Location *)local_128);
    RVar5 = ParseLabelOpt(this,(string *)(local_128._0_8_ + 0x40));
    if ((((RVar5.enum_ == Error) ||
         (RVar5 = ParseBlockDeclaration
                            (this,(BlockDeclaration *)
                                  &(((Expr *)(local_128._0_8_ + 0x40))->loc).filename._M_str),
         RVar5.enum_ == Error)) || (RVar5 = Expect(this,Lpar), RVar5.enum_ == Error)) ||
       (((RVar5 = Expect(this,Do), RVar5.enum_ == Error ||
         (RVar5 = ParseInstrList(this,(ExprList *)
                                      &(((Expr *)(local_128._0_8_ + 0xc0))->loc).filename._M_str),
         RVar5.enum_ == Error)) || (RVar5 = Expect(this,Rpar), RVar5.enum_ == Error))))
    goto LAB_0015148b;
    TVar3 = Peek(this,0);
    if (TVar3 == Lpar) {
      Consume((Token *)&cond,this);
      TVar3 = Peek(this,0);
      if (TVar3 - Catch < 2) {
        RVar5 = ParseCatchExprList(this,(CatchVector *)&((Expr *)(local_128._0_8_ + 0x100))->loc);
        if (RVar5.enum_ == Error) goto LAB_0015148b;
        *(undefined4 *)(local_128._0_8_ + 0x3c) = 1;
        goto LAB_00151883;
      }
      if (TVar3 != Delegate) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&cond,"catch",&local_129);
        std::__cxx11::string::string<std::allocator<char>>(local_d8,"catch_all",&local_119);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b8,"delegate",(allocator<char> *)(local_128 + 0xe));
        local_118.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
        local_118._8_8_ = 0;
        local_108 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                   &cond,local_98);
        ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_118.field_0,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_118.field_0);
        lVar7 = 0x40;
        do {
          std::__cxx11::string::_M_dispose();
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
        goto LAB_00151883;
      }
      Consume((Token *)&cond,this);
      Var::Var((Var *)&cond);
      RVar5 = ParseVar(this,(Var *)&cond);
      if (RVar5.enum_ == Error) {
        Var::~Var((Var *)&cond);
      }
      else {
        Var::operator=((Var *)((long)&(((Expr *)(local_128._0_8_ + 0x100))->loc).field_1 + 8),
                       (Var *)&cond);
        *(undefined4 *)(local_128._0_8_ + 0x3c) = 2;
        RVar5 = Expect(this,Rpar);
        Var::~Var((Var *)&cond);
        if (RVar5.enum_ != Error) goto LAB_00151883;
      }
LAB_0015148b:
      bVar2 = false;
    }
    else {
LAB_00151883:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cond,"a valid try clause",&local_129);
      local_118.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      local_118._8_8_ = 0;
      local_108 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 &cond,local_d8);
      bVar2 = false;
      RVar5 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_118.field_0,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_118.field_0);
      std::__cxx11::string::_M_dispose();
      if (RVar5.enum_ != Error) {
        GetLocation((Location *)&cond,this);
        local_80._M_head_impl = (Expr *)local_128._0_8_;
        (((Expr *)(local_128._0_8_ + 0x100))->super_intrusive_list_base<wabt::Expr>).next_ =
             (Expr *)cond.size_;
        (((Expr *)(local_128._0_8_ + 0x100))->super_intrusive_list_base<wabt::Expr>).prev_ =
             (Expr *)uStack_e0;
        *(Expr **)&((Expr *)(local_128._0_8_ + 0xc0))->type_ = cond.first_;
        ((Expr *)(local_128._0_8_ + 0x100))->_vptr_Expr = (_func_int **)cond.last_;
        local_128._0_8_ = (Expr *)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_80);
        if (local_80._M_head_impl != (Expr *)0x0) {
          (*(local_80._M_head_impl)->_vptr_Expr[1])();
        }
        local_80._M_head_impl = (Expr *)0x0;
        bVar2 = true;
      }
    }
    if ((Expr *)local_128._0_8_ != (Expr *)0x0) {
      (*(*(_func_int ***)local_128._0_8_)[1])();
    }
  }
  if (!bVar2) {
    return (Result)Error;
  }
LAB_00151717:
  RVar5 = Expect(this,Rpar);
  return (Result)(uint)(RVar5.enum_ == Error);
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        while (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        EXPECT(Lpar);
        if (!Match(TokenType::Then)) {
          return ErrorExpected({"then block"}, "(then ...)");
        }

        CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
        expr->true_.end_loc = GetLocation();
        EXPECT(Rpar);

        if (MatchLpar(TokenType::Else)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
          EXPECT(Rpar);
        }
        expr->false_end_loc = GetLocation();

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::TryTable: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = std::make_unique<TryTableExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseTryTableCatches(&expr->catches));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}